

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O1

void soul::ASTUtilities::resolveHoistedEndpoints(Allocator *allocator,ModuleBase *module)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Graph *g;
  undefined8 *extraout_RDX;
  pool_ref<soul::AST::ModuleBase> *m;
  undefined8 *puVar3;
  
  iVar2 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  for (puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2); puVar3 != extraout_RDX;
      puVar3 = puVar3 + 1) {
    resolveHoistedEndpoints(allocator,(ModuleBase *)*puVar3);
  }
  g = (Graph *)__dynamic_cast(module,&AST::ModuleBase::typeinfo,&AST::Graph::typeinfo,0);
  if (g != (Graph *)0x0) {
    do {
      bVar1 = hoistFirstChildEndpoint(allocator,g);
    } while (bVar1);
  }
  return;
}

Assistant:

static void resolveHoistedEndpoints (AST::Allocator& allocator, AST::ModuleBase& module)
    {
        for (auto& m : module.getSubModules())
            resolveHoistedEndpoints (allocator, m);

        if (auto graph = cast<AST::Graph> (module))
        {
            while (hoistFirstChildEndpoint (allocator, *graph))
            {}
        }
    }